

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constpool.cpp
# Opt level: O0

void __thiscall asmjit::ConstPool::Tree::put(Tree *this,Node *newNode)

{
  long *plVar1;
  int iVar2;
  uint uVar3;
  long in_RSI;
  long *in_RDI;
  Node *link;
  uint dir;
  uint top;
  Node *stack [64];
  Node *node;
  size_t dataSize;
  uint32_t level;
  Node *link_1;
  uint32_t level_1;
  Node *link_2;
  uint local_270;
  uint local_26c;
  long alStack_268 [65];
  long *local_60;
  size_t local_58;
  long local_50;
  long local_40;
  long local_38;
  uint local_2c;
  long local_28;
  long *local_20;
  uint local_14;
  long *local_10;
  long *local_8;
  
  local_58 = in_RDI[2];
  in_RDI[1] = in_RDI[1] + 1;
  if (*in_RDI == 0) {
    *in_RDI = in_RSI;
  }
  else {
    local_26c = 0;
    plVar1 = (long *)*in_RDI;
    local_50 = in_RSI;
    do {
      local_60 = plVar1;
      uVar3 = local_26c + 1;
      alStack_268[local_26c] = (long)local_60;
      local_38 = (long)local_60;
      local_40 = local_50;
      iVar2 = memcmp((void *)((long)local_60 + 0x18),(void *)(local_50 + 0x18),local_58);
      local_270 = (uint)(iVar2 < 0);
      plVar1 = *(long **)((long)local_60 + (ulong)local_270 * 8);
      local_26c = uVar3;
    } while (plVar1 != (long *)0x0);
    *(long *)((long)local_60 + (ulong)local_270 * 8) = local_50;
    while (local_26c != 0) {
      uVar3 = local_26c - 1;
      local_60 = (long *)alStack_268[uVar3];
      if (uVar3 != 0) {
        local_270 = (uint)(*(long **)(alStack_268[local_26c - 2] + 8) == local_60);
      }
      local_20 = local_60;
      local_28 = *local_60;
      local_2c = *(uint *)(local_60 + 2) & 0x7fffffff;
      if (((local_2c != 0) && (local_28 != 0)) &&
         ((*(uint *)(local_28 + 0x10) & 0x7fffffff) == local_2c)) {
        *local_60 = *(long *)(local_28 + 8);
        *(long **)(local_28 + 8) = local_60;
        local_20 = (long *)local_28;
      }
      local_8 = local_20;
      local_10 = (long *)local_20[1];
      local_14 = *(uint *)(local_20 + 2) & 0x7fffffff;
      if (((local_14 != 0) && (local_10 != (long *)0x0)) &&
         ((local_10[1] != 0 && ((*(uint *)(local_10[1] + 0x10) & 0x7fffffff) == local_14)))) {
        local_20[1] = *local_10;
        *local_10 = (long)local_20;
        local_8 = local_10;
        *(uint *)(local_10 + 2) =
             *(uint *)(local_10 + 2) & 0x80000000 |
             (*(uint *)(local_10 + 2) & 0x7fffffff) + 1 & 0x7fffffff;
      }
      local_60 = local_8;
      if (uVar3 == 0) {
        *in_RDI = (long)local_8;
        local_26c = uVar3;
      }
      else {
        *(long **)(alStack_268[local_26c - 2] + (ulong)local_270 * 8) = local_8;
        local_26c = uVar3;
      }
    }
  }
  return;
}

Assistant:

void ConstPool::Tree::put(ConstPool::Node* newNode) noexcept {
  size_t dataSize = _dataSize;
  _length++;

  if (!_root) {
    _root = newNode;
    return;
  }

  ConstPool::Node* node = _root;
  ConstPool::Node* stack[kHeightLimit];

  unsigned int top = 0;
  unsigned int dir;

  // Find a spot and save the stack.
  for (;;) {
    stack[top++] = node;
    dir = ::memcmp(node->getData(), newNode->getData(), dataSize) < 0;

    ConstPool::Node* link = node->_link[dir];
    if (!link) break;

    node = link;
  }

  // Link and rebalance.
  node->_link[dir] = newNode;

  while (top > 0) {
    // Which child?
    node = stack[--top];

    if (top != 0) {
      dir = stack[top - 1]->_link[1] == node;
    }

    node = ConstPoolTree_skewNode(node);
    node = ConstPoolTree_splitNode(node);

    // Fix the parent.
    if (top != 0)
      stack[top - 1]->_link[dir] = node;
    else
      _root = node;
  }
}